

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::NetAliasSymbol::getNetReferences(NetAliasSymbol *this)

{
  SourceRange sourceRange;
  DriverBitRange firstRange_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar1;
  bitwidth_t bVar2;
  bool bVar3;
  bitwidth_t bVar4;
  int iVar5;
  NetAliasSyntax *pNVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  Compilation *pCVar8;
  undefined4 extraout_var_00;
  Symbol *scope_00;
  pair<std::pair<unsigned_long,_unsigned_long>,_bool> *ppVar10;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *psVar11;
  EVP_PKEY_CTX *src;
  Symbol *in_RDI;
  LookupLocation LVar12;
  uint64_t width;
  unsigned_long secondWidth;
  unsigned_long firstWidth;
  DriverBitRange secondRange;
  DriverBitRange firstRange;
  NetAlias *secondAlias;
  NetAlias *firstAlias;
  optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> remainder;
  iterator secondEnd;
  iterator secondIt;
  iterator firstEnd;
  iterator firstIt;
  SmallVector<slang::ast::NetAlias,_2UL> *second;
  SmallVector<slang::ast::NetAlias,_2UL> *first;
  size_t j;
  size_t i;
  size_t numAliases;
  Compilation *comp;
  Diagnostic *diag;
  Expression *netRef;
  ExpressionSyntax *exprSyntax;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  bool issuedError;
  bitwidth_t bitWidth;
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> netAliases;
  NetAliasVisitor visitor;
  EvalContext evalCtx;
  ASTContext context;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  SyntaxNode *syntax;
  Scope *scope;
  NetAliasVisitor *in_stack_fffffffffffff758;
  EvalContext *in_stack_fffffffffffff760;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *in_stack_fffffffffffff768;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff770;
  Scope *in_stack_fffffffffffff778;
  SourceLocation in_stack_fffffffffffff780;
  SourceLocation in_stack_fffffffffffff788;
  ASTContext *in_stack_fffffffffffff790;
  EvalContext *in_stack_fffffffffffff798;
  undefined8 in_stack_fffffffffffff7a0;
  bitmask<slang::ast::EvalFlags> flags;
  unsigned_long local_760;
  pair<unsigned_long,_unsigned_long> local_758;
  Expression *in_stack_fffffffffffff8b8;
  ASTContext *in_stack_fffffffffffff8c0;
  Expression *in_stack_fffffffffffff8c8;
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffff8d7;
  SourceLocation in_stack_fffffffffffff8d8;
  pair<unsigned_long,_unsigned_long> local_720;
  pair<std::pair<unsigned_long,_unsigned_long>,_bool> local_710;
  bool local_6f1;
  unsigned_long local_6f0;
  pair<unsigned_long,_unsigned_long> local_6e8;
  pair<std::pair<unsigned_long,_unsigned_long>,_bool> local_6d8;
  ulong local_6c0;
  ulong local_6b8;
  ulong local_6b0;
  pair<unsigned_long,_unsigned_long> local_6a8;
  pair<unsigned_long,_unsigned_long> local_698;
  iterator local_688;
  iterator local_680;
  iterator local_658;
  iterator local_650;
  iterator local_648;
  iterator local_640;
  reference local_638;
  reference local_630;
  Symbol *firstExpr;
  Symbol *firstSym;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  bitmask<slang::ast::AssignFlags> local_5c1;
  SourceLocation local_5c0;
  bitmask<slang::ast::ASTFlags> local_5b8;
  undefined8 local_5b0;
  ExpressionSyntax *local_5a8;
  const_iterator local_5a0;
  const_iterator local_590;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_580;
  byte local_575;
  bitwidth_t local_574;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> local_570 [2];
  Symbol *in_stack_fffffffffffffb70;
  DriverBitRange in_stack_fffffffffffffb78;
  Expression *in_stack_fffffffffffffb88;
  bitmask<slang::ast::EvalFlags> local_429 [849];
  underlying_type local_d8;
  Scope *local_d0;
  uint32_t local_c8;
  Scope *local_b0;
  uint32_t local_a8;
  sockaddr local_a0 [3];
  SmallVectorBase<const_slang::ast::Expression_*> local_68 [2];
  SyntaxNode *local_28;
  Scope *local_20;
  pointer local_10;
  __extent_storage<18446744073709551615UL> local_8;
  unsigned_long uVar9;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff7a0 >> 0x38);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      *)0x1006ac8);
  if (bVar3) {
    psVar11 = std::optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*((optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           *)0x1006adf);
    local_10 = psVar11->_M_ptr;
    local_8._M_extent_value = (psVar11->_M_extent)._M_extent_value;
    goto LAB_01007764;
  }
  local_20 = Symbol::getParentScope(in_RDI);
  local_28 = Symbol::getSyntax(in_RDI);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1006b34);
  LVar12 = LookupLocation::after((Symbol *)in_stack_fffffffffffff760);
  local_d0 = LVar12.scope;
  local_c8 = LVar12.index;
  local_b0 = local_d0;
  local_a8 = local_c8;
  local_d8 = (underlying_type)
             ast::operator|((ASTFlags)in_stack_fffffffffffff768,(ASTFlags)in_stack_fffffffffffff760)
  ;
  LVar12._8_8_ = in_stack_fffffffffffff780;
  LVar12.scope = in_stack_fffffffffffff778;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffff768,(Scope *)in_stack_fffffffffffff760,LVar12,
             in_stack_fffffffffffff770);
  local_429[0].m_bits = '\0';
  bitmask<slang::ast::EvalFlags>::bitmask(local_429);
  EvalContext::EvalContext(in_stack_fffffffffffff798,in_stack_fffffffffffff790,flags);
  NetAliasVisitor::NetAliasVisitor
            ((NetAliasVisitor *)in_stack_fffffffffffff770.m_bits,
             (ASTContext *)in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL>::SmallVector
            ((SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> *)0x1006c48);
  local_574 = 0;
  local_575 = 0;
  pNVar6 = slang::syntax::SyntaxNode::as<slang::syntax::NetAliasSyntax>(local_28);
  local_580 = &pNVar6->nets;
  local_590 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x1006c93);
  local_5a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x1006cd2);
  while( true ) {
    bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffff760,
                       (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                       in_stack_fffffffffffff758);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pEVar7 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                          *)0x1006d41);
    local_5a8 = pEVar7;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_5b8,None);
    iVar5 = Expression::bind((int)pEVar7,local_a0,(socklen_t)local_5b8.m_bits);
    local_5b0 = CONCAT44(extraout_var,iVar5);
    SourceLocation::SourceLocation(&local_5c0);
    local_5c1.m_bits = '\0';
    bitmask<slang::ast::AssignFlags>::bitmask(&local_5c1);
    bVar3 = Expression::requireLValue
                      (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8d8
                       ,in_stack_fffffffffffff8d7,in_stack_fffffffffffff8b8);
    bVar2 = local_574;
    if (bVar3) {
      if (local_574 == 0) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x1006eac);
        local_574 = Type::getBitWidth((Type *)in_stack_fffffffffffff768);
      }
      else {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x1006efe);
        bVar4 = Type::getBitWidth((Type *)in_stack_fffffffffffff768);
        if ((bVar2 != bVar4) && ((local_575 & 1) == 0)) {
          sourceRange.endLoc = in_stack_fffffffffffff788;
          sourceRange.startLoc = in_stack_fffffffffffff780;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff778,
                              SUB84((ulong)in_stack_fffffffffffff790 >> 0x20,0),sourceRange);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x1006fc0);
          Type::getBitWidth((Type *)in_stack_fffffffffffff768);
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)in_stack_fffffffffffff770.m_bits,
                     (uint)((ulong)in_stack_fffffffffffff768 >> 0x20));
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)in_stack_fffffffffffff770.m_bits,
                     (uint)((ulong)in_stack_fffffffffffff768 >> 0x20));
          local_575 = 1;
        }
      }
      Expression::visit<slang::ast::NetAliasVisitor&>
                ((Expression *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff760,
                 (Expression **)in_stack_fffffffffffff758);
      bVar3 = SmallVectorBase<slang::ast::NetAlias>::empty
                        ((SmallVectorBase<slang::ast::NetAlias> *)(local_570[1].firstElement + 0x50)
                        );
      if (!bVar3) {
        SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
        emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
                  (in_stack_fffffffffffff768,
                   (SmallVector<slang::ast::NetAlias,_2UL> *)in_stack_fffffffffffff760);
        SmallVectorBase<slang::ast::NetAlias>::clear
                  ((SmallVectorBase<slang::ast::NetAlias> *)in_stack_fffffffffffff760);
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffff760);
  }
  pCVar8 = Scope::getCompilation(local_20);
  iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_68,(EVP_PKEY_CTX *)pCVar8,src)
  ;
  uVar9 = CONCAT44(extraout_var_00,iVar5);
  std::optional<std::span<slang::ast::Expression_const*const,18446744073709551615ul>>::operator=
            ((optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_> *)
             in_stack_fffffffffffff770.m_bits,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
             in_stack_fffffffffffff768);
  if ((local_575 & 1) == 0) {
    bVar3 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::empty(local_570);
    if (bVar3) goto LAB_01007137;
    pCVar8 = Scope::getCompilation(local_20);
    scope_00 = (Symbol *)
               SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::size(local_570);
    for (firstSym = (Symbol *)0x0; firstExpr = firstSym,
        firstSym < (Symbol *)((long)&scope_00[-1].originatingSyntax + 7U);
        firstSym = (Symbol *)((long)&firstSym->kind + 1)) {
      while (firstExpr = (Symbol *)((long)&firstExpr->kind + 1), firstExpr < scope_00) {
        local_630 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::operator[]
                              (local_570,(size_type)firstSym);
        local_638 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::operator[]
                              (local_570,(size_type)firstExpr);
        local_640 = SmallVectorBase<slang::ast::NetAlias>::begin
                              (&local_630->super_SmallVectorBase<slang::ast::NetAlias>);
        local_648 = SmallVectorBase<slang::ast::NetAlias>::end
                              (&local_630->super_SmallVectorBase<slang::ast::NetAlias>);
        local_650 = SmallVectorBase<slang::ast::NetAlias>::begin
                              (&local_638->super_SmallVectorBase<slang::ast::NetAlias>);
        local_658 = SmallVectorBase<slang::ast::NetAlias>::end
                              (&local_638->super_SmallVectorBase<slang::ast::NetAlias>);
        std::optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>::optional
                  ((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> *)0x10072ab)
        ;
        while (local_640 != local_648 && local_650 != local_658) {
          local_680 = local_640;
          local_688 = local_650;
          local_698.first = (local_640->bounds).first;
          local_698.second = (local_640->bounds).second;
          local_6a8.first = (local_650->bounds).first;
          local_6a8.second = (local_650->bounds).second;
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> *)
                             0x1007354);
          if (bVar3) {
            ppVar10 = std::optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>::
                      operator->((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>
                                  *)0x1007367);
            if ((ppVar10->second & 1U) == 0) {
              ppVar10 = std::optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>::
                        operator->((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>
                                    *)0x100739b);
              std::pair<unsigned_long,_unsigned_long>::operator=(&local_6a8,&ppVar10->first);
            }
            else {
              ppVar10 = std::optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>::
                        operator->((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>
                                    *)0x100737a);
              std::pair<unsigned_long,_unsigned_long>::operator=(&local_698,&ppVar10->first);
            }
            std::optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_>::reset
                      ((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> *)
                       0x10073bc);
          }
          local_6b0 = (local_698.second - local_698.first) + 1;
          local_6c0 = (local_6a8.second - local_6a8.first) + 1;
          local_6b8 = local_6c0;
          if (local_6b0 < local_6c0) {
            local_6f0 = local_6a8.second - local_6b0;
            local_6c0 = local_6b0;
            std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                      (&local_6e8,&local_6a8.first,&local_6f0);
            local_6f1 = false;
            std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>::
            pair<std::pair<unsigned_long,_unsigned_long>,_bool,_true>
                      (&local_6d8,&local_6e8,&local_6f1);
            std::optional<std::pair<std::pair<unsigned_long,unsigned_long>,bool>>::operator=
                      ((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> *)
                       in_stack_fffffffffffff770.m_bits,
                       (pair<std::pair<unsigned_long,_unsigned_long>,_bool> *)
                       in_stack_fffffffffffff768);
            local_640 = local_640 + 1;
          }
          else {
            local_650 = local_650 + 1;
            if (local_6b0 == local_6c0) {
              local_640 = local_640 + 1;
            }
            else {
              std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                        (&local_720,&local_698.first,(unsigned_long *)&stack0xfffffffffffff8d8);
              std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>::
              pair<std::pair<unsigned_long,_unsigned_long>,_bool,_true>
                        (&local_710,&local_720,(bool *)&stack0xfffffffffffff8d7);
              std::optional<std::pair<std::pair<unsigned_long,unsigned_long>,bool>>::operator=
                        ((optional<std::pair<std::pair<unsigned_long,_unsigned_long>,_bool>_> *)
                         in_stack_fffffffffffff770.m_bits,
                         (pair<std::pair<unsigned_long,_unsigned_long>,_bool> *)
                         in_stack_fffffffffffff768);
            }
          }
          not_null<const_slang::ast::ValueSymbol_*>::operator*
                    ((not_null<const_slang::ast::ValueSymbol_*> *)0x1007594);
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long_&,_true>
                    ((pair<unsigned_long,_unsigned_long> *)&stack0xfffffffffffff8c0,
                     (unsigned_long *)&stack0xfffffffffffff8b8,&local_698.second);
          not_null<const_slang::ast::Expression_*>::operator*
                    ((not_null<const_slang::ast::Expression_*> *)0x10075e9);
          not_null<const_slang::ast::ValueSymbol_*>::operator*
                    ((not_null<const_slang::ast::ValueSymbol_*> *)0x10075fd);
          local_760 = (local_6a8.second - local_6c0) + 1;
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long_&,_true>
                    (&local_758,&local_760,&local_6a8.second);
          in_stack_fffffffffffff770.m_bits =
               (underlying_type)
               not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0x1007652);
          firstRange_00.first._4_4_ = in_stack_fffffffffffff9fc;
          firstRange_00.first._0_4_ = in_stack_fffffffffffff9f8;
          firstRange_00.second = uVar9;
          in_stack_fffffffffffff760 = (EvalContext *)local_758.first;
          in_stack_fffffffffffff768 =
               (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *)local_758.second;
          Compilation::noteNetAlias
                    (pCVar8,(Scope *)scope_00,firstSym,firstRange_00,(Expression *)firstExpr,
                     in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb88);
        }
      }
    }
    psVar11 = std::optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*((optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           *)0x10076f0);
    local_10 = psVar11->_M_ptr;
    local_8._M_extent_value = (psVar11->_M_extent)._M_extent_value;
  }
  else {
LAB_01007137:
    psVar11 = std::optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*((optional<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           *)0x1007148);
    local_10 = psVar11->_M_ptr;
    local_8._M_extent_value = (psVar11->_M_extent)._M_extent_value;
  }
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL>::~SmallVector
            ((SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> *)0x100771f);
  NetAliasVisitor::~NetAliasVisitor((NetAliasVisitor *)0x100772c);
  EvalContext::~EvalContext(in_stack_fffffffffffff760);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1007746);
LAB_01007764:
  sVar1._M_extent._M_extent_value = local_8._M_extent_value;
  sVar1._M_ptr = local_10;
  return sVar1;
}

Assistant:

std::span<const Expression* const> NetAliasSymbol::getNetReferences() const {
    if (netRefs)
        return *netRefs;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    SmallVector<const Expression*> buffer;
    ASTContext context(*scope, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::NotADriver);
    EvalContext evalCtx(context);
    NetAliasVisitor visitor(context, evalCtx);
    SmallVector<SmallVector<NetAlias>> netAliases;
    bitwidth_t bitWidth = 0;
    bool issuedError = false;

    for (auto exprSyntax : syntax->as<NetAliasSyntax>().nets) {
        auto& netRef = Expression::bind(*exprSyntax, context);
        if (!netRef.requireLValue(context))
            continue;

        if (!bitWidth) {
            bitWidth = netRef.type->getBitWidth();
        }
        else if (bitWidth != netRef.type->getBitWidth() && !issuedError) {
            auto& diag = context.addDiag(diag::NetAliasWidthMismatch, netRef.sourceRange);
            diag << netRef.type->getBitWidth() << bitWidth;
            issuedError = true;
        }

        netRef.visit(visitor);
        buffer.push_back(&netRef);
        if (!visitor.netAliases.empty()) {
            netAliases.emplace_back(std::move(visitor.netAliases));
            visitor.netAliases.clear();
        }
    }

    netRefs = buffer.copy(scope->getCompilation());
    if (issuedError || netAliases.empty())
        return *netRefs;

    // Compare every net alias expression to every other, finding the set of
    // bits that overlap and adding drivers for them so that we can catch
    // and report on duplicate and/or self aliases.
    auto& comp = scope->getCompilation();
    const size_t numAliases = netAliases.size();
    for (size_t i = 0; i < numAliases - 1; i++) {
        for (size_t j = i + 1; j < numAliases; j++) {
            auto& first = netAliases[i];
            auto& second = netAliases[j];
            auto firstIt = first.begin();
            auto firstEnd = first.end();
            auto secondIt = second.begin();
            auto secondEnd = second.end();

            // Compare each net reference or selection from the left hand side
            // to the corresponding elements on the right hand side. The individual
            // elements can differ in width, so consume bits from the larger side
            // and only advance when a side has been consumed.
            std::optional<std::pair<DriverBitRange, bool>> remainder;
            while (firstIt != firstEnd && secondIt != secondEnd) {
                auto& firstAlias = *firstIt;
                auto& secondAlias = *secondIt;
                auto firstRange = firstAlias.bounds;
                auto secondRange = secondAlias.bounds;

                if (remainder) {
                    if (remainder->second)
                        firstRange = remainder->first;
                    else
                        secondRange = remainder->first;
                    remainder.reset();
                }

                auto firstWidth = firstRange.second - firstRange.first + 1;
                auto secondWidth = secondRange.second - secondRange.first + 1;

                uint64_t width;
                if (firstWidth < secondWidth) {
                    width = firstWidth;
                    remainder = std::pair(
                        DriverBitRange(secondRange.first, secondRange.second - width), false);
                    firstIt++;
                }
                else {
                    width = secondWidth;
                    secondIt++;

                    if (firstWidth == secondWidth)
                        firstIt++;
                    else {
                        remainder = std::pair(
                            DriverBitRange(firstRange.first, firstRange.second - width), true);
                    }
                }

                comp.noteNetAlias(*scope, *firstAlias.sym,
                                  {firstRange.second - width + 1, firstRange.second},
                                  *firstAlias.expr, *secondAlias.sym,
                                  {secondRange.second - width + 1, secondRange.second},
                                  *secondAlias.expr);
            }
        }
    }

    return *netRefs;
}